

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

ostream * nlohmann::operator<<
                    (ostream *o,
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *j)

{
  ostream *poVar1;
  long lVar2;
  ostream oVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  long lVar4;
  serializer s;
  output_adapter_t<char> local_2c8;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_2b8;
  
  lVar2 = *(long *)(o + *(long *)(*(long *)o + -0x18) + 0x10);
  lVar4 = 0;
  if (0 < lVar2) {
    lVar4 = lVar2;
  }
  *(undefined8 *)(o + *(long *)(*(long *)o + -0x18) + 0x10) = 0;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00122c80;
  local_2c8.
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(this + 1);
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR_write_character_00122cd0;
  *(ostream **)&this[1]._M_use_count = o;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = 2;
  }
  poVar1 = o + *(long *)(*(long *)o + -0x18);
  local_2c8.
  super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = this;
  if (o[*(long *)(*(long *)o + -0x18) + 0xe1] == (ostream)0x0) {
    oVar3 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar3;
    poVar1[0xe1] = (ostream)0x1;
  }
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::serializer(&local_2b8,&local_2c8,(char)poVar1[0xe0],as_is);
  if (local_2c8.
      super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::dump(&local_2b8,j,0 < lVar2,false,(uint)lVar4,0);
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::~serializer(&local_2b8);
  return o;
}

Assistant:

friend std::ostream& operator<<(std::ostream& o, const basic_json& j)
    {
        // read width member and use it as indentation parameter if nonzero
        const bool pretty_print = o.width() > 0;
        const auto indentation = pretty_print ? o.width() : 0;

        // reset width to 0 for subsequent calls to this stream
        o.width(0);

        // do the actual serialization
        serializer s(detail::output_adapter<char>(o), o.fill());
        s.dump(j, pretty_print, false, static_cast<unsigned int>(indentation));
        return o;
    }